

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O1

void mocker::anon_unknown_1::storeVReg
               (shared_ptr<mocker::nasm::Register> *dest,shared_ptr<mocker::nasm::Addr> *val,
               RegMap<std::size_t> *offsets,Section *text)

{
  long lVar1;
  int iVar2;
  const_iterator cVar3;
  shared_ptr<mocker::nasm::MemoryAddr> memAddr;
  undefined1 local_31;
  unsigned_long local_30;
  shared_ptr<mocker::nasm::MemoryAddr> local_28;
  
  cVar3 = std::
          _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&offsets->_M_h,dest);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    lVar1 = *(long *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>,_true>
                            ._M_cur + 0x18);
    if (nasm::rbp()::res == '\0') {
      iVar2 = __cxa_guard_acquire(&nasm::rbp()::res);
      if (iVar2 != 0) {
        nasm::rbp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rbp::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rbp::res,
                   (allocator<mocker::nasm::Register> *)&local_30,(char (*) [4])"rbp");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rbp::res,&__dso_handle);
        __cxa_guard_release(&nasm::rbp()::res);
      }
    }
    local_30 = -lVar1;
    local_28.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&,unsigned_long>
              (&local_28.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(MemoryAddr **)&local_28,
               (allocator<mocker::nasm::MemoryAddr> *)&local_31,&nasm::rbp::res,&local_30);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>const&>
              (text,&local_28,val);
    if (local_28.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void storeVReg(const std::shared_ptr<nasm::Register> &dest,
               const std::shared_ptr<nasm::Addr> &val,
               const RegMap<std::size_t> &offsets, nasm::Section &text) {
  auto offset = offsets.at(dest);
  auto memAddr = std::make_shared<nasm::MemoryAddr>(nasm::rbp(), -offset);
  text.emplaceInst<nasm::Mov>(memAddr, val);
}